

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_int64 StreamReadLine(io_private *pDev,char **pzData,jx9_int64 nMaxLen)

{
  jx9_io_stream *pjVar1;
  uint uVar2;
  sxi32 sVar3;
  sxu32 sVar4;
  uint uVar5;
  jx9_int64 jVar6;
  ulong uVar7;
  char zBuf [8192];
  ulong local_2050;
  char **local_2048;
  SyBlob *local_2040;
  undefined1 local_2038 [8200];
  
  pjVar1 = pDev->pStream;
  local_2050 = 0;
  uVar2 = (pDev->sBuffer).nByte;
  uVar5 = pDev->nOfft;
  local_2040 = &pDev->sBuffer;
  local_2048 = pzData;
  if (uVar2 <= uVar5) {
    SyBlobReset(local_2040);
    pDev->nOfft = 0;
    uVar2 = (pDev->sBuffer).nByte;
    uVar5 = 0;
  }
  if ((uVar2 == uVar5) || (sVar3 = GetLine(pDev,(jx9_int64 *)&local_2050,local_2048), sVar3 != 0)) {
    jVar6 = 0x2000;
    if (nMaxLen - 1U < 0x1fff) {
      jVar6 = nMaxLen;
    }
    do {
      do {
        local_2050 = (*pjVar1->xRead)(pDev->pHandle,local_2038,jVar6);
        if ((long)local_2050 < 1) {
          uVar2 = (pDev->sBuffer).nByte;
          uVar5 = pDev->nOfft;
          if (uVar2 == uVar5) {
            return local_2050;
          }
          *local_2048 = (char *)((ulong)uVar5 + (long)(pDev->sBuffer).pBlob);
          uVar7 = (ulong)(uVar2 - uVar5);
          SyBlobReset(local_2040);
          sVar4 = 0;
          goto LAB_00137920;
        }
        SyBlobAppend(local_2040,local_2038,(sxu32)local_2050);
        sVar3 = GetLine(pDev,(jx9_int64 *)&local_2050,local_2048);
        if (sVar3 == 0) goto LAB_001378e6;
      } while (nMaxLen < 1);
      uVar7 = (ulong)((pDev->sBuffer).nByte - pDev->nOfft);
    } while (uVar7 < (ulong)nMaxLen);
    *local_2048 = (char *)((ulong)pDev->nOfft + (long)(pDev->sBuffer).pBlob);
    SyBlobReset(local_2040);
    sVar4 = 0;
  }
  else {
LAB_001378e6:
    sVar4 = pDev->nOfft + (int)local_2050;
    uVar7 = local_2050;
  }
LAB_00137920:
  pDev->nOfft = sVar4;
  return uVar7;
}

Assistant:

static jx9_int64 StreamReadLine(io_private *pDev, const char **pzData, jx9_int64 nMaxLen)
{
	const jx9_io_stream *pStream = pDev->pStream;
	char zBuf[8192];
	jx9_int64 n;
	sxi32 rc;
	n = 0;
	if( pDev->nOfft >= SyBlobLength(&pDev->sBuffer) ){
		/* Reset the working buffer so that we avoid excessive memory allocation */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Check if there is a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got line, update the cursor  */
			pDev->nOfft += (sxu32)n;
			return n;
		}
	}
	/* Perform the read operation until a new line is extracted or length
	 * limit is reached.
	 */
	for(;;){
		n = pStream->xRead(pDev->pHandle, zBuf, (nMaxLen > 0 && nMaxLen < sizeof(zBuf)) ? nMaxLen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Append the data just read */
		SyBlobAppend(&pDev->sBuffer, zBuf, (sxu32)n);
		/* Try to extract a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got one, return immediately */
			pDev->nOfft += (sxu32)n;
			return n;
		}
		if( nMaxLen > 0 && (SyBlobLength(&pDev->sBuffer) - pDev->nOfft >= nMaxLen) ){
			/* Read limit reached, return the available data */
			*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
			n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
			/* Reset the working buffer */
			SyBlobReset(&pDev->sBuffer);
			pDev->nOfft = 0;
			return n;
		}
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Read limit reached, return the available data */
		*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
		n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
		/* Reset the working buffer */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	return n;
}